

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O2

void __thiscall
TestRegenerateCmakeAddSubdirectory_NoSubDirs::Run
          (TestRegenerateCmakeAddSubdirectory_NoSubDirs *this)

{
  __type _Var1;
  runtime_error *this_00;
  string expectedOutput;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  TemporaryWorkingDirectory workdir;
  ostringstream oss;
  Component comp;
  
  TemporaryWorkingDirectory::TemporaryWorkingDirectory(&workdir,(this->super_Test).name);
  boost::filesystem::path::path((path *)&oss,"MyComponent");
  boost::filesystem::operator/(&comp.root,&workdir.workDir,(path *)&oss);
  boost::filesystem::create_directories(&comp.root);
  std::__cxx11::string::~string((string *)&comp);
  std::__cxx11::string::~string((string *)&oss);
  boost::filesystem::path::path((path *)&oss,"./MyComponent/");
  Component::Component(&comp,(path *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::string((string *)&expectedOutput,"",(allocator *)&oss);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  RegenerateCmakeAddSubdirectory((ostream *)&oss,&comp);
  std::__cxx11::stringbuf::str();
  _Var1 = std::operator==(&local_430,&expectedOutput);
  std::__cxx11::string::~string((string *)&local_430);
  if (_Var1) {
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    std::__cxx11::string::~string((string *)&expectedOutput);
    Component::~Component(&comp);
    TemporaryWorkingDirectory::~TemporaryWorkingDirectory(&workdir);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed: oss.str() == expectedOutput");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TEST(RegenerateCmakeAddSubdirectory_NoSubDirs) {
  TemporaryWorkingDirectory workdir(name);
  filesystem::create_directories(workdir() / "MyComponent");

  Component comp("./MyComponent/");

  const std::string expectedOutput("");

  std::ostringstream oss;
  RegenerateCmakeAddSubdirectory(oss, comp);

  ASSERT(oss.str() == expectedOutput);
}